

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode h2_progress_egress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  byte *pbVar1;
  undefined8 *puVar2;
  HTTP *pHVar3;
  uint *puVar4;
  void *pvVar5;
  _Bool _Var6;
  uint lib_error_code;
  int iVar7;
  char *pcVar8;
  ssize_t sVar9;
  size_t sVar10;
  int iVar11;
  CURLcode CVar12;
  nghttp2_priority_spec pri_spec;
  nghttp2_priority_spec local_34;
  
  puVar2 = (undefined8 *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (pHVar3 = (data->req).p.http, pHVar3 != (HTTP *)0x0)) &&
      (puVar4 = (uint *)pHVar3->h2_ctx, puVar4 != (uint *)0x0)) && (0 < (int)*puVar4)) {
    iVar7 = (data->set).priority.weight;
    if (iVar7 == 0) {
      iVar7 = 0x10;
    }
    iVar11 = (data->state).priority.weight;
    if (iVar11 == 0) {
      iVar11 = 0x10;
    }
    if (((iVar7 != iVar11) ||
        ((((data->state).priority.field_0x14 ^ (data->set).priority.field_0x14) & 1) != 0)) ||
       ((data->set).priority.parent != (data->state).priority.parent)) {
      h2_pri_spec(data,&local_34);
      if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] Queuing PRIORITY",(ulong)*puVar4);
      }
      lib_error_code = nghttp2_submit_priority((nghttp2_session *)*puVar2,'\0',*puVar4,&local_34);
      if (lib_error_code != 0) {
        iVar7 = nghttp2_is_fatal(lib_error_code);
        if (iVar7 != 0) goto LAB_0062f28f;
        goto LAB_0062f2d8;
      }
    }
  }
  *(byte *)(puVar2 + 0x19) = *(byte *)(puVar2 + 0x19) & 0xf7;
  do {
    lib_error_code = 0;
    if (((*(byte *)(puVar2 + 0x19) & 8) != 0) ||
       (iVar7 = nghttp2_session_want_write((nghttp2_session *)*puVar2), lib_error_code = 0,
       iVar7 == 0)) break;
    lib_error_code = nghttp2_session_send((nghttp2_session *)*puVar2);
  } while (lib_error_code == 0);
  iVar7 = nghttp2_is_fatal(lib_error_code);
  if (iVar7 != 0) {
    if (data == (Curl_easy *)0x0) {
      return CURLE_SEND_ERROR;
    }
LAB_0062f28f:
    if (cf == (Curl_cfilter *)0x0) {
      return CURLE_SEND_ERROR;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return CURLE_SEND_ERROR;
    }
    if (cf->cft->log_level < 1) {
      return CURLE_SEND_ERROR;
    }
    pcVar8 = nghttp2_strerror(lib_error_code);
    Curl_trc_cf_infof(data,cf,"nghttp2_session_send error (%s)%d",pcVar8,(ulong)lib_error_code);
    return CURLE_SEND_ERROR;
  }
LAB_0062f2d8:
  pvVar5 = cf->ctx;
  q = (bufq *)((long)pvVar5 + 0x58);
  _Var6 = Curl_bufq_is_empty(q);
  CVar12 = CURLE_OK;
  if (!_Var6) {
    sVar9 = Curl_bufq_pass(q,nw_out_writer,cf,(CURLcode *)&local_34);
    if (sVar9 < 0) {
      CVar12 = local_34.stream_id;
      if (local_34.stream_id == CURLE_AGAIN) {
        CVar12 = CURLE_AGAIN;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          sVar10 = Curl_bufq_len(q);
          Curl_trc_cf_infof(data,cf,"flush nw send buffer(%zu) -> EAGAIN",sVar10);
          CVar12 = local_34.stream_id;
        }
        pbVar1 = (byte *)((long)pvVar5 + 200);
        *pbVar1 = *pbVar1 | 8;
      }
    }
    else {
      _Var6 = Curl_bufq_is_empty(q);
      CVar12 = CURLE_AGAIN;
      if (_Var6) {
        CVar12 = CURLE_OK;
      }
    }
  }
  return CVar12;
}

Assistant:

static CURLcode h2_progress_egress(struct Curl_cfilter *cf,
                                  struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  int rv = 0;

  if(stream && stream->id > 0 &&
     ((sweight_wanted(data) != sweight_in_effect(data)) ||
      (data->set.priority.exclusive != data->state.priority.exclusive) ||
      (data->set.priority.parent != data->state.priority.parent)) ) {
    /* send new weight and/or dependency */
    nghttp2_priority_spec pri_spec;

    h2_pri_spec(data, &pri_spec);
    CURL_TRC_CF(data, cf, "[%d] Queuing PRIORITY", stream->id);
    DEBUGASSERT(stream->id != -1);
    rv = nghttp2_submit_priority(ctx->h2, NGHTTP2_FLAG_NONE,
                                 stream->id, &pri_spec);
    if(rv)
      goto out;
  }

  ctx->nw_out_blocked = 0;
  while(!rv && !ctx->nw_out_blocked && nghttp2_session_want_write(ctx->h2))
    rv = nghttp2_session_send(ctx->h2);

out:
  if(nghttp2_is_fatal(rv)) {
    CURL_TRC_CF(data, cf, "nghttp2_session_send error (%s)%d",
                nghttp2_strerror(rv), rv);
    return CURLE_SEND_ERROR;
  }
  return nw_out_flush(cf, data);
}